

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnetfil.h
# Opt level: O3

void __thiscall CVmNetFile::abandon(CVmNetFile *this)

{
  if (this->srvfname != (char *)0x0) {
    remove(this->lclfname);
  }
  ~CVmNetFile(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

void abandon(VMG0_)
    {
#ifdef TADSNET
        /* delete the temp file */
        if (srvfname != 0)
            osfdel(lclfname);
#endif

        /* free self */
        delete this;
    }